

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugWriter.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::DebugWriter::PrintQuotedString(DebugWriter *this,Char *str,CharCount len)

{
  char16 *form;
  
  if (this->nlPending == true) {
    Output::Print(L"\n%*s",(ulong)(uint)(this->indent << 2),L"");
    this->nlPending = false;
  }
  if (str == (Char *)0x0) {
    form = L"null";
  }
  else {
    form = L"\"";
    Output::Print(L"\"");
    PrintEscapedString(this,str,len);
  }
  Output::Print(form);
  return;
}

Assistant:

void DebugWriter::PrintQuotedString(const Char* str, CharCount len)
    {
        CheckForNewline();
        if (str == 0)
            Output::Print(_u("null"));
        else
        {
            Output::Print(_u("\""));
            PrintEscapedString(str, len);
            Output::Print(_u("\""));
        }
    }